

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O0

double * __thiscall linalg::vec<double,_4>::operator[](vec<double,_4> *this,int i)

{
  vec<double,_4> *local_38;
  vec<double,_4> *local_30;
  vec<double,_4> *local_28;
  int i_local;
  vec<double,_4> *this_local;
  
  local_28 = this;
  if (i != 0) {
    if (i == 1) {
      local_30 = (vec<double,_4> *)&this->y;
    }
    else {
      if (i == 2) {
        local_38 = (vec<double,_4> *)&this->z;
      }
      else {
        local_38 = (vec<double,_4> *)&this->w;
      }
      local_30 = local_38;
    }
    local_28 = local_30;
  }
  return &local_28->x;
}

Assistant:

LINALG_CONSTEXPR14 T &      operator[] (int i)                  { return i==0?x:i==1?y:i==2?z:w; }